

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_connection.c
# Opt level: O0

apx_error_t remote_file_published_notification(apx_serverConnection_t *self,apx_file_t *file)

{
  apx_fileType_t aVar1;
  apx_fileType_t file_type;
  apx_file_t *file_local;
  apx_serverConnection_t *self_local;
  
  if ((self == (apx_serverConnection_t *)0x0) || (file == (apx_file_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    aVar1 = apx_file_get_apx_file_type(file);
    if (aVar1 == '\x02') {
      self_local._4_4_ = process_new_provide_port_data_file(self,file);
    }
    else if (aVar1 == '\x01') {
      self_local._4_4_ = process_new_definition_data_file(self,file);
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t remote_file_published_notification(apx_clientConnection_t* self, apx_file_t* file)
{
   if ((self != NULL) && (file != NULL))
   {
#if APX_DEBUG_ENABLE
      printf("[CLIENT-CONNECTION] remote_file_published_notification: \"%s\"(%d)\n", apx_file_get_name(file), apx_file_get_apx_file_type(file));
#endif
      if (apx_file_get_apx_file_type(file) == APX_REQUIRE_PORT_DATA_FILE_TYPE)
      {
         return process_new_require_port_data_file(self, file);
      }
      //TODO: Add generic handling of new file types
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}